

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

void __thiscall IR::IndirOpnd::SetIndexOpnd(IndirOpnd *this,RegOpnd *indexOpnd)

{
  RegOpnd *pRVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  
  pRVar1 = this->m_indexOpnd;
  if (pRVar1 != (RegOpnd *)0x0) {
    bVar4 = (pRVar1->super_Opnd).field_0xb;
    if ((bVar4 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x2a,"(m_inUse)","Expected inUse to be set...");
      if (!bVar3) goto LAB_00618dc1;
      *puVar5 = 0;
      bVar4 = (pRVar1->super_Opnd).field_0xb;
    }
    (pRVar1->super_Opnd).field_0xb = bVar4 & 0xfd;
  }
  if (indexOpnd == (RegOpnd *)0x0) {
    indexOpnd = (RegOpnd *)0x0;
  }
  else {
    func = this->m_func;
    if ((indexOpnd->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) goto LAB_00618dc1;
      *puVar5 = 0;
    }
    bVar4 = (indexOpnd->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      indexOpnd = (RegOpnd *)Opnd::Copy(&indexOpnd->super_Opnd,func);
      bVar4 = (indexOpnd->super_Opnd).field_0xb;
    }
    (indexOpnd->super_Opnd).field_0xb = bVar4 | 2;
    if ((indexOpnd->super_Opnd).m_kind != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
LAB_00618dc1:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  this->m_indexOpnd = indexOpnd;
  return;
}

Assistant:

void
IndirOpnd::SetIndexOpnd(RegOpnd *indexOpnd)
{
    if (m_indexOpnd)
    {
        m_indexOpnd->UnUse();
    }
    if (indexOpnd)
    {
        indexOpnd = indexOpnd->Use(m_func)->AsRegOpnd();
    }

    m_indexOpnd = indexOpnd;
}